

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputSource.cc
# Opt level: O2

size_t __thiscall
InputSource::read_line(InputSource *this,string *str,size_t count,qpdf_offset_t at)

{
  _If_sv<std::basic_string_view<char>,_size_type> __pos;
  _If_sv<std::basic_string_view<char>,_size_type> _Var1;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  read(this,(int)str,(void *)count,at);
  local_30._M_len = 2;
  local_30._M_str = "\n\r";
  __pos = std::__cxx11::string::find_first_of<std::basic_string_view<char,std::char_traits<char>>>
                    ((string *)str,&local_30,0);
  if (__pos == 0xffffffffffffffff) {
    (*this->_vptr_InputSource[5])(this,this->last_offset,0);
    (*this->_vptr_InputSource[2])(this);
  }
  else {
    local_30._M_len = 2;
    local_30._M_str = "\n\r";
    _Var1 = std::__cxx11::string::
            find_first_not_of<std::basic_string_view<char,std::char_traits<char>>>
                      ((string *)str,&local_30,__pos);
    std::__cxx11::string::resize((ulong)str);
    (*this->_vptr_InputSource[5])(this,_Var1 + this->last_offset,0);
  }
  return __pos;
}

Assistant:

size_t
InputSource::read_line(std::string& str, size_t count, qpdf_offset_t at)
{
    // Return at most max_line_length characters from the next line. Lines are terminated by one or
    // more \r or \n characters. Consume the trailing newline characters but don't return them.
    // After this is called, the file will be positioned after a line terminator or at the end of
    // the file, and last_offset will point to position the file had when this method was called.

    read(str, count, at);
    auto eol = str.find_first_of("\n\r"sv);
    if (eol != std::string::npos) {
        auto next_line = str.find_first_not_of("\n\r"sv, eol);
        str.resize(eol);
        if (eol != std::string::npos) {
            seek(last_offset + static_cast<qpdf_offset_t>(next_line), SEEK_SET);
            return eol;
        }
    }
    // We did not necessarily find the end of the trailing newline sequence.
    seek(last_offset, SEEK_SET);
    findAndSkipNextEOL();
    return eol;
}